

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

void readScanLine(InputPart *in,FrameBuffer *buf,vector<double,_std::allocator<double>_> *perf)

{
  int iVar1;
  long lVar2;
  long lVar3;
  double local_38;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  Imf_3_4::InputPart::header();
  lVar3 = Imf_3_4::Header::dataWindow();
  iVar1 = *(int *)(lVar3 + 4);
  Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)in);
  Imf_3_4::InputPart::readPixels((int)in,iVar1);
  lVar3 = std::chrono::_V2::steady_clock::now();
  local_38 = (double)(lVar3 - lVar2) / 1000000000.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(perf,&local_38);
  return;
}

Assistant:

void
readScanLine (InputPart& in, FrameBuffer& buf, vector<double>& perf)
{
    steady_clock::time_point start = steady_clock::now ();
    Box2i                    dw    = in.header ().dataWindow ();
    in.setFrameBuffer (buf);
    in.readPixels (dw.min.y, dw.max.y);
    steady_clock::time_point end = steady_clock::now ();
    perf.push_back (timing (start, end));
}